

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prng_add_entropy(prng *pr,uint source_id,ptrlen data)

{
  uint64_t uVar1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_d8;
  ulong local_c8;
  size_t i;
  uchar local_b8 [4];
  uint32_t reseed_index;
  uchar buf [114];
  size_t index;
  uint32_t counter;
  prng_impl *pi;
  uint source_id_local;
  prng *pr_local;
  ptrlen data_local;
  
  if (0x10 < source_id) {
    __assert_fail("source_id < NOISE_MAX_SOURCES",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xf4,"void prng_add_entropy(prng *, unsigned int, ptrlen)");
  }
  index._4_4_ = *(int *)((long)&pr[2].binarysink_[0].write + (ulong)source_id * 4) + 1;
  *(uint *)((long)&pr[2].binarysink_[0].write + (ulong)source_id * 4) = index._4_4_;
  for (stack0xffffffffffffffc0 = 0; stack0xffffffffffffffc0 + 1U < 0x20 && (index._4_4_ & 1) == 0;
      register0x00000000 = stack0xffffffffffffffc0 + 1) {
    index._4_4_ = index._4_4_ >> 1;
  }
  BinarySink_put_datapl
            (*(BinarySink **)((&pr[4].binarysink_[0].writefmtv)[stack0xffffffffffffffc0] + 8),data);
  if (stack0xffffffffffffffc0 == 0) {
    if (pr[0xc].binarysink_[0].writefmtv <
        (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)data.len) {
      local_d8 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
    }
    else {
      local_d8 = pr[0xc].binarysink_[0].writefmtv + -(long)data.len;
    }
    pr[0xc].binarysink_[0].writefmtv = local_d8;
  }
  if ((pr[0xc].binarysink_[0].writefmtv ==
       (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) &&
     (uVar1 = prng_reseed_time_ms(), 99 < uVar1 - pr[0xd].savesize)) {
    prng_seed_begin(pr);
    i._4_4_ = *(int *)&pr[0xc].binarysink_[0].binarysink_ + 1;
    *(uint *)&pr[0xc].binarysink_[0].binarysink_ = i._4_4_;
    for (local_c8 = 0; local_c8 < 0x20; local_c8 = local_c8 + 1) {
      ssh_hash_digest((ssh_hash *)(&pr[4].binarysink_[0].writefmtv)[local_c8],local_b8);
      BinarySink_put_data(pr->binarysink_,local_b8,*(size_t *)(pr[1].savesize + 0x28));
      ssh_hash_reset((ssh_hash *)(&pr[4].binarysink_[0].writefmtv)[local_c8]);
      if ((i._4_4_ & 1) != 0) break;
      i._4_4_ = i._4_4_ >> 1;
    }
    smemclr(local_b8,0x72);
    prng_seed_finish(pr);
  }
  return;
}

Assistant:

void prng_add_entropy(prng *pr, unsigned source_id, ptrlen data)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);

    assert(source_id < NOISE_MAX_SOURCES);
    uint32_t counter = ++pi->source_counters[source_id];

    size_t index = 0;
    while (index+1 < NCOLLECTORS && !(counter & 1)) {
        counter >>= 1;
        index++;
    }

    prngdebug("prng_add_entropy source=%u size=%"SIZEu" -> collector %zi\n",
              source_id, data.len, index);

    put_datapl(pi->collectors[index], data);

    if (index == 0)
        pi->until_reseed = (pi->until_reseed < data.len ? 0 :
                            pi->until_reseed - data.len);

    if (pi->until_reseed == 0 &&
        prng_reseed_time_ms() - pi->last_reseed_time >= 100) {
        prng_seed_begin(&pi->Prng);

        unsigned char buf[MAX_HASH_LEN];
        uint32_t reseed_index = ++pi->reseeds;
        prngdebug("prng entropy reseed #%"PRIu32"\n", reseed_index);
        for (size_t i = 0; i < NCOLLECTORS; i++) {
            prngdebug("emptying collector %"SIZEu"\n", i);
            ssh_hash_digest(pi->collectors[i], buf);
            put_data(&pi->Prng, buf, pi->hashalg->hlen);
            ssh_hash_reset(pi->collectors[i]);
            if (reseed_index & 1)
                break;
            reseed_index >>= 1;
        }
        smemclr(buf, sizeof(buf));
        prng_seed_finish(&pi->Prng);
    }
}